

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTuple.h
# Opt level: O1

void __thiscall
chrono::ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_>::Update_auxiliary
          (ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_> *this,double *g_i)

{
  if (this->variables->disabled == false) {
    (*this->variables->_vptr_ChVariables[4])();
  }
  if (this->variables->disabled == false) {
    *g_i = (this->Cq).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
           array[0] *
           (this->Eq).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0] +
           (this->Cq).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
           array[1] *
           (this->Eq).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1] +
           (this->Cq).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
           array[2] *
           (this->Eq).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] + *g_i;
  }
  return;
}

Assistant:

void Update_auxiliary(double& g_i) {
        // 1- Assuming jacobians are already computed, now compute
        //   the matrices [Eq]=[invM]*[Cq]' and [Eq]
        if (variables->IsActive()) {
            variables->Compute_invMb_v(Eq, Cq.transpose());
        }

        // 2- Compute g_i = [Cq_i]*[invM_i]*[Cq_i]' + cfm_i
        if (variables->IsActive()) {
            g_i += Cq * Eq;
        }
    }